

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O1

vector<Pathie::Path,_std::allocator<Pathie::Path>_> * __thiscall
Pathie::Path::children
          (vector<Pathie::Path,_std::allocator<Pathie::Path>_> *__return_storage_ptr__,Path *this)

{
  void *__n;
  size_t __n_00;
  bool bVar1;
  int iVar2;
  Path *pPVar3;
  bool bVar4;
  entry_iterator iter;
  string local_c8;
  undefined1 local_a8 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  char local_78 [16];
  entry_iterator local_68;
  Path local_50;
  
  (__return_storage_ptr__->super__Vector_base<Pathie::Path,_std::allocator<Pathie::Path>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Pathie::Path,_std::allocator<Pathie::Path>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Pathie::Path,_std::allocator<Pathie::Path>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  entry_iterator::entry_iterator(&local_68,this);
  do {
    entry_iterator::entry_iterator((entry_iterator *)local_a8);
    bVar1 = entry_iterator::operator!=(&local_68,(entry_iterator *)local_a8);
    entry_iterator::~entry_iterator((entry_iterator *)local_a8);
    if (!bVar1) {
      entry_iterator::~entry_iterator(&local_68);
      return __return_storage_ptr__;
    }
    pPVar3 = entry_iterator::operator*(&local_68);
    local_88._M_allocated_capacity = (size_type)local_78;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,".","");
    Path((Path *)local_a8,(string *)&local_88);
    __n = (void *)(pPVar3->m_path)._M_string_length;
    bVar1 = true;
    if (__n == (void *)local_a8._8_8_) {
      if (__n == (void *)0x0) {
        bVar1 = false;
      }
      else {
        iVar2 = bcmp((pPVar3->m_path)._M_dataplus._M_p,(void *)local_a8._0_8_,(size_t)__n);
        bVar1 = iVar2 != 0;
      }
    }
    if (bVar1) {
      pPVar3 = entry_iterator::operator*(&local_68);
      local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"..","");
      Path(&local_50,&local_c8);
      __n_00 = (pPVar3->m_path)._M_string_length;
      bVar4 = true;
      if (__n_00 == local_50.m_path._M_string_length) {
        if (__n_00 == 0) goto LAB_0010ab1c;
        iVar2 = bcmp((pPVar3->m_path)._M_dataplus._M_p,local_50.m_path._M_dataplus._M_p,__n_00);
        bVar4 = iVar2 != 0;
      }
    }
    else {
LAB_0010ab1c:
      bVar4 = false;
    }
    if (bVar1) {
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50.m_path._M_dataplus._M_p != &local_50.m_path.field_2) {
        operator_delete(local_50.m_path._M_dataplus._M_p);
      }
      if ((bVar1) &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_dataplus._M_p != &local_c8.field_2)) {
        operator_delete(local_c8._M_dataplus._M_p);
      }
    }
    if ((Path *)local_a8._0_8_ != (Path *)(local_a8 + 0x10)) {
      operator_delete((void *)local_a8._0_8_);
    }
    if ((char *)local_88._M_allocated_capacity != local_78) {
      operator_delete((void *)local_88._M_allocated_capacity);
    }
    if (bVar4) {
      pPVar3 = entry_iterator::operator*(&local_68);
      std::vector<Pathie::Path,_std::allocator<Pathie::Path>_>::push_back
                (__return_storage_ptr__,pPVar3);
    }
    entry_iterator::operator++(&local_68,0);
  } while( true );
}

Assistant:

Path::Path()
{
  m_path = ".";
}